

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

void elf_lzma_range_normalize
               (uchar *compressed,size_t compressed_size,size_t *poffset,uint32_t *prange,
               uint32_t *pcode)

{
  uint32_t uVar1;
  ulong uVar2;
  
  if ((*prange < 0x1000000) && (uVar2 = *poffset, uVar2 < compressed_size)) {
    *prange = *prange << 8;
    uVar1 = *pcode;
    *pcode = uVar1 << 8;
    *pcode = (uint)compressed[uVar2] | uVar1 << 8;
    *poffset = uVar2 + 1;
  }
  return;
}

Assistant:

static void
elf_lzma_range_normalize (const unsigned char *compressed,
			  size_t compressed_size, size_t *poffset,
			  uint32_t *prange, uint32_t *pcode)
{
  if (*prange < (1U << 24))
    {
      if (unlikely (*poffset >= compressed_size))
	{
	  /* We assume this will be caught elsewhere.  */
	  elf_uncompress_failed ();
	  return;
	}
      *prange <<= 8;
      *pcode <<= 8;
      *pcode += compressed[*poffset];
      ++*poffset;
    }
}